

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_short,_void,_false>::mul_by_limb
          (uintwide_t<48U,_unsigned_short,_void,_false> *this,limb_type_conflict v)

{
  iterator puVar1;
  iterator last;
  const_iterator a;
  limb_type_conflict v_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  if (v == 0) {
    puVar1 = detail::array_detail::array<unsigned_short,_3UL>::begin
                       ((array<unsigned_short,_3UL> *)this);
    last = detail::array_detail::array<unsigned_short,_3UL>::end((array<unsigned_short,_3UL> *)this)
    ;
    detail::fill_unsafe<unsigned_short*,unsigned_short>(puVar1,last,0);
  }
  else if (1 < v) {
    puVar1 = detail::array_detail::array<unsigned_short,_3UL>::begin
                       ((array<unsigned_short,_3UL> *)this);
    a = detail::array_detail::array<unsigned_short,_3UL>::cbegin((array<unsigned_short,_3UL> *)this)
    ;
    uintwide_t<48u,unsigned_short,void,false>::
    eval_multiply_1d<unsigned_short*,unsigned_short_const*>(puVar1,a,v,3);
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto mul_by_limb(const limb_type v) -> uintwide_t&
    {
      if(v == static_cast<limb_type>(UINT8_C(0)))
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0)));
      }
      else if(v > static_cast<limb_type>(UINT8_C(1)))
      {
        static_cast<void>(eval_multiply_1d(values.begin(),
                                           values.cbegin(),
                                           v,
                                           number_of_limbs));
      }

      return *this;
    }